

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void embree::avx512::
     BVHNIntersector1<8,_1,_true,_embree::avx512::ArrayIntersector1<embree::avx512::QuadMiIntersector1Pluecker<4,_true>_>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  float fVar1;
  undefined4 uVar7;
  float fVar8;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar9;
  float **ppfVar10;
  float *pfVar11;
  float *pfVar12;
  float *pfVar13;
  float *pfVar14;
  bool bVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined8 uVar18;
  undefined8 uVar19;
  ulong uVar20;
  undefined8 uVar21;
  long lVar22;
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  ulong uVar28;
  long lVar29;
  uint uVar30;
  ulong uVar31;
  ulong uVar32;
  Scene *pSVar33;
  RTCIntersectArguments *pRVar34;
  ulong uVar35;
  ulong uVar36;
  ulong uVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  float fVar66;
  undefined1 auVar67 [64];
  undefined1 auVar68 [16];
  undefined1 auVar69 [64];
  undefined1 auVar70 [32];
  undefined1 auVar71 [64];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [64];
  float fVar76;
  float fVar77;
  float fVar78;
  float fVar79;
  float fVar80;
  float fVar81;
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [64];
  undefined1 auVar85 [64];
  undefined1 auVar86 [64];
  undefined1 auVar87 [64];
  undefined1 auVar88 [64];
  undefined1 auVar89 [64];
  Scene *scene;
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  NodeRef stack [564];
  int local_161c;
  ulong local_1618;
  Scene *local_1610;
  RTCIntersectArguments *local_1608;
  Geometry *local_1600;
  ulong local_15f8;
  ulong local_15f0;
  ulong local_15e8;
  RayQueryContext *local_15e0;
  ulong *local_15d8;
  long local_15d0;
  long local_15c8;
  undefined4 local_15c0;
  undefined4 local_15bc;
  undefined4 local_15b8;
  undefined4 local_15b4;
  undefined4 local_15b0;
  undefined4 local_15ac;
  uint local_15a8;
  uint local_15a4;
  uint local_15a0;
  RTCFilterFunctionNArguments local_1590;
  undefined1 local_1560 [32];
  undefined1 local_1540 [32];
  undefined1 local_1520 [32];
  undefined1 local_1500 [32];
  float local_14e0;
  float fStack_14dc;
  float fStack_14d8;
  float fStack_14d4;
  float fStack_14d0;
  float fStack_14cc;
  float fStack_14c8;
  float fStack_14c4;
  undefined1 local_14c0 [32];
  undefined1 local_14a0 [32];
  undefined1 local_1480 [32];
  undefined1 local_1460 [32];
  undefined1 local_1440 [32];
  undefined1 local_1420 [32];
  undefined8 local_1400;
  undefined8 uStack_13f8;
  undefined8 uStack_13f0;
  undefined8 uStack_13e8;
  undefined8 local_13e0;
  undefined8 uStack_13d8;
  undefined8 uStack_13d0;
  undefined8 uStack_13c8;
  undefined1 local_13c0 [32];
  undefined1 local_13a0 [32];
  undefined1 local_1380 [32];
  undefined1 local_1360 [32];
  undefined1 local_1340 [32];
  undefined1 local_1320 [32];
  byte local_1300;
  undefined1 local_12e0 [32];
  undefined1 local_12c0 [32];
  undefined1 local_12a0 [32];
  undefined1 local_1280 [32];
  undefined1 local_1260 [32];
  undefined1 local_1240 [32];
  undefined1 local_1220;
  ulong local_1200 [570];
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  undefined1 auVar40 [16];
  
  local_1200[0] = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_1200[0] != 8) {
    fVar76 = ray->tfar;
    if (0.0 <= fVar76) {
      aVar9 = (ray->dir).field_0;
      auVar16 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      auVar38._8_4_ = 0x7fffffff;
      auVar38._0_8_ = 0x7fffffff7fffffff;
      auVar38._12_4_ = 0x7fffffff;
      auVar38 = vandps_avx512vl((undefined1  [16])aVar9,auVar38);
      local_15d8 = local_1200 + 1;
      auVar39._8_4_ = 0x219392ef;
      auVar39._0_8_ = 0x219392ef219392ef;
      auVar39._12_4_ = 0x219392ef;
      uVar35 = vcmpps_avx512vl(auVar38,auVar39,1);
      auVar68._8_4_ = 0x3f800000;
      auVar68._0_8_ = 0x3f8000003f800000;
      auVar68._12_4_ = 0x3f800000;
      auVar38 = vdivps_avx(auVar68,(undefined1  [16])aVar9);
      auVar39 = vbroadcastss_avx512vl(ZEXT416(0x5d5e0b6b));
      bVar15 = (bool)((byte)uVar35 & 1);
      auVar40._0_4_ = (uint)bVar15 * auVar39._0_4_ | (uint)!bVar15 * auVar38._0_4_;
      bVar15 = (bool)((byte)(uVar35 >> 1) & 1);
      auVar40._4_4_ = (uint)bVar15 * auVar39._4_4_ | (uint)!bVar15 * auVar38._4_4_;
      bVar15 = (bool)((byte)(uVar35 >> 2) & 1);
      auVar40._8_4_ = (uint)bVar15 * auVar39._8_4_ | (uint)!bVar15 * auVar38._8_4_;
      bVar15 = (bool)((byte)(uVar35 >> 3) & 1);
      auVar40._12_4_ = (uint)bVar15 * auVar39._12_4_ | (uint)!bVar15 * auVar38._12_4_;
      auVar41._8_4_ = 0x3f7ffffa;
      auVar41._0_8_ = 0x3f7ffffa3f7ffffa;
      auVar41._12_4_ = 0x3f7ffffa;
      auVar41 = vmulps_avx512vl(auVar40,auVar41);
      auVar42._8_4_ = 0x3f800003;
      auVar42._0_8_ = 0x3f8000033f800003;
      auVar42._12_4_ = 0x3f800003;
      auVar42 = vmulps_avx512vl(auVar40,auVar42);
      auVar43 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->org).field_0.m128[0]));
      auVar84 = ZEXT3264(auVar43);
      auVar43 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->org).field_0.m128[1]));
      auVar85 = ZEXT3264(auVar43);
      auVar43 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->org).field_0.m128[2]));
      auVar86 = ZEXT3264(auVar43);
      auVar43 = vbroadcastss_avx512vl(auVar41);
      auVar87 = ZEXT3264(auVar43);
      auVar38 = vmovshdup_avx(auVar41);
      auVar43 = vbroadcastsd_avx512vl(auVar38);
      auVar88 = ZEXT3264(auVar43);
      auVar39 = vshufpd_avx(auVar41,auVar41,1);
      auVar44._8_4_ = 2;
      auVar44._0_8_ = 0x200000002;
      auVar44._12_4_ = 2;
      auVar44._16_4_ = 2;
      auVar44._20_4_ = 2;
      auVar44._24_4_ = 2;
      auVar44._28_4_ = 2;
      auVar43 = vpermps_avx512vl(auVar44,ZEXT1632(auVar41));
      auVar89 = ZEXT3264(auVar43);
      fVar66 = auVar42._0_4_;
      auVar43._8_4_ = 1;
      auVar43._0_8_ = 0x100000001;
      auVar43._12_4_ = 1;
      auVar43._16_4_ = 1;
      auVar43._20_4_ = 1;
      auVar43._24_4_ = 1;
      auVar43._28_4_ = 1;
      local_1500 = vpermps_avx2(auVar43,ZEXT1632(auVar42));
      auVar69 = ZEXT3264(local_1500);
      local_1520 = vpermps_avx2(auVar44,ZEXT1632(auVar42));
      auVar75 = ZEXT3264(local_1520);
      local_15e8 = (ulong)(auVar41._0_4_ < 0.0) << 5;
      local_15f0 = (ulong)(auVar38._0_4_ < 0.0) << 5 | 0x40;
      uVar35 = (ulong)(auVar39._0_4_ < 0.0) << 5 | 0x80;
      uVar36 = local_15e8 ^ 0x20;
      uVar37 = local_15f0 ^ 0x20;
      local_1540._0_4_ = auVar16._0_4_;
      local_1540._4_4_ = local_1540._0_4_;
      local_1540._8_4_ = local_1540._0_4_;
      local_1540._12_4_ = local_1540._0_4_;
      local_1540._16_4_ = local_1540._0_4_;
      local_1540._20_4_ = local_1540._0_4_;
      local_1540._24_4_ = local_1540._0_4_;
      local_1540._28_4_ = local_1540._0_4_;
      auVar67 = ZEXT3264(local_1540);
      local_1560._4_4_ = fVar76;
      local_1560._0_4_ = fVar76;
      local_1560._8_4_ = fVar76;
      local_1560._12_4_ = fVar76;
      local_1560._16_4_ = fVar76;
      local_1560._20_4_ = fVar76;
      local_1560._24_4_ = fVar76;
      local_1560._28_4_ = fVar76;
      auVar71 = ZEXT3264(local_1560);
      local_14e0 = fVar66;
      fStack_14dc = fVar66;
      fStack_14d8 = fVar66;
      fStack_14d4 = fVar66;
      fStack_14d0 = fVar66;
      fStack_14cc = fVar66;
      fStack_14c8 = fVar66;
      fStack_14c4 = fVar66;
      local_15e0 = context;
      fVar76 = fVar66;
      fVar77 = fVar66;
      fVar78 = fVar66;
      fVar79 = fVar66;
      fVar80 = fVar66;
      fVar81 = fVar66;
LAB_01c6e5b4:
      if (local_15d8 != local_1200) {
        uVar32 = local_15d8[-1];
        local_15d8 = local_15d8 + -1;
        while ((uVar32 & 8) == 0) {
          auVar43 = vsubps_avx512vl(*(undefined1 (*) [32])(uVar32 + 0x40 + local_15e8),
                                    auVar84._0_32_);
          auVar43 = vmulps_avx512vl(auVar87._0_32_,auVar43);
          auVar44 = vsubps_avx512vl(*(undefined1 (*) [32])(uVar32 + 0x40 + local_15f0),
                                    auVar85._0_32_);
          auVar44 = vmulps_avx512vl(auVar88._0_32_,auVar44);
          auVar43 = vmaxps_avx(auVar43,auVar44);
          auVar44 = vsubps_avx512vl(*(undefined1 (*) [32])(uVar32 + 0x40 + uVar35),auVar86._0_32_);
          auVar44 = vmulps_avx512vl(auVar89._0_32_,auVar44);
          auVar44 = vmaxps_avx(auVar44,auVar67._0_32_);
          auVar43 = vmaxps_avx(auVar43,auVar44);
          auVar44 = vsubps_avx512vl(*(undefined1 (*) [32])(uVar32 + 0x40 + uVar36),auVar84._0_32_);
          auVar45._4_4_ = fVar76 * auVar44._4_4_;
          auVar45._0_4_ = fVar66 * auVar44._0_4_;
          auVar45._8_4_ = fVar77 * auVar44._8_4_;
          auVar45._12_4_ = fVar78 * auVar44._12_4_;
          auVar45._16_4_ = fVar79 * auVar44._16_4_;
          auVar45._20_4_ = fVar80 * auVar44._20_4_;
          auVar45._24_4_ = fVar81 * auVar44._24_4_;
          auVar45._28_4_ = auVar44._28_4_;
          auVar44 = vsubps_avx512vl(*(undefined1 (*) [32])(uVar32 + 0x40 + uVar37),auVar85._0_32_);
          auVar48._4_4_ = auVar69._4_4_ * auVar44._4_4_;
          auVar48._0_4_ = auVar69._0_4_ * auVar44._0_4_;
          auVar48._8_4_ = auVar69._8_4_ * auVar44._8_4_;
          auVar48._12_4_ = auVar69._12_4_ * auVar44._12_4_;
          auVar48._16_4_ = auVar69._16_4_ * auVar44._16_4_;
          auVar48._20_4_ = auVar69._20_4_ * auVar44._20_4_;
          auVar48._24_4_ = auVar69._24_4_ * auVar44._24_4_;
          auVar48._28_4_ = auVar44._28_4_;
          auVar44 = vminps_avx(auVar45,auVar48);
          auVar45 = vsubps_avx512vl(*(undefined1 (*) [32])(uVar32 + 0x40 + (uVar35 ^ 0x20)),
                                    auVar86._0_32_);
          auVar46._4_4_ = auVar75._4_4_ * auVar45._4_4_;
          auVar46._0_4_ = auVar75._0_4_ * auVar45._0_4_;
          auVar46._8_4_ = auVar75._8_4_ * auVar45._8_4_;
          auVar46._12_4_ = auVar75._12_4_ * auVar45._12_4_;
          auVar46._16_4_ = auVar75._16_4_ * auVar45._16_4_;
          auVar46._20_4_ = auVar75._20_4_ * auVar45._20_4_;
          auVar46._24_4_ = auVar75._24_4_ * auVar45._24_4_;
          auVar46._28_4_ = auVar45._28_4_;
          auVar45 = vminps_avx(auVar46,auVar71._0_32_);
          auVar44 = vminps_avx(auVar44,auVar45);
          uVar31 = vcmpps_avx512vl(auVar43,auVar44,2);
          if ((char)uVar31 == '\0') goto LAB_01c6e5b4;
          uVar28 = uVar32 & 0xfffffffffffffff0;
          lVar22 = 0;
          for (uVar32 = uVar31; (uVar32 & 1) == 0; uVar32 = uVar32 >> 1 | 0x8000000000000000) {
            lVar22 = lVar22 + 1;
          }
          uVar32 = *(ulong *)(uVar28 + lVar22 * 8);
          uVar30 = (uint)uVar31 - 1 & (uint)uVar31;
          uVar31 = (ulong)uVar30;
          if (uVar30 != 0) {
            do {
              *local_15d8 = uVar32;
              local_15d8 = local_15d8 + 1;
              lVar22 = 0;
              for (uVar32 = uVar31; (uVar32 & 1) == 0; uVar32 = uVar32 >> 1 | 0x8000000000000000) {
                lVar22 = lVar22 + 1;
              }
              uVar31 = uVar31 - 1 & uVar31;
              uVar32 = *(ulong *)(uVar28 + lVar22 * 8);
            } while (uVar31 != 0);
          }
        }
        local_15c8 = (ulong)((uint)uVar32 & 0xf) - 8;
        uVar32 = uVar32 & 0xfffffffffffffff0;
        for (local_15d0 = 0; local_15d0 != local_15c8; local_15d0 = local_15d0 + 1) {
          lVar29 = local_15d0 * 0x60;
          pSVar33 = local_15e0->scene;
          local_1610 = pSVar33;
          ppfVar10 = (pSVar33->vertices).items;
          pfVar11 = ppfVar10[*(uint *)(uVar32 + 0x48 + lVar29)];
          auVar49._16_16_ = *(undefined1 (*) [16])(pfVar11 + *(uint *)(uVar32 + 0x28 + lVar29));
          auVar49._0_16_ = *(undefined1 (*) [16])(pfVar11 + *(uint *)(uVar32 + 8 + lVar29));
          pfVar12 = ppfVar10[*(uint *)(uVar32 + 0x40 + lVar29)];
          auVar50._16_16_ = *(undefined1 (*) [16])(pfVar12 + *(uint *)(uVar32 + 0x20 + lVar29));
          auVar50._0_16_ = *(undefined1 (*) [16])(pfVar12 + *(uint *)(uVar32 + lVar29));
          pfVar13 = ppfVar10[*(uint *)(uVar32 + 0x4c + lVar29)];
          auVar54._16_16_ = *(undefined1 (*) [16])(pfVar13 + *(uint *)(uVar32 + 0x2c + lVar29));
          auVar54._0_16_ = *(undefined1 (*) [16])(pfVar13 + *(uint *)(uVar32 + 0xc + lVar29));
          pfVar14 = ppfVar10[*(uint *)(uVar32 + 0x44 + lVar29)];
          auVar55._16_16_ = *(undefined1 (*) [16])(pfVar14 + *(uint *)(uVar32 + 0x24 + lVar29));
          auVar55._0_16_ = *(undefined1 (*) [16])(pfVar14 + *(uint *)(uVar32 + 4 + lVar29));
          lVar22 = uVar32 + 0x40 + lVar29;
          local_13e0 = *(undefined8 *)(lVar22 + 0x10);
          uStack_13d8 = *(undefined8 *)(lVar22 + 0x18);
          uStack_13d0 = local_13e0;
          uStack_13c8 = uStack_13d8;
          lVar22 = uVar32 + 0x50 + lVar29;
          local_1400 = *(undefined8 *)(lVar22 + 0x10);
          uStack_13f8 = *(undefined8 *)(lVar22 + 0x18);
          auVar39 = vunpcklps_avx(*(undefined1 (*) [16])
                                   (pfVar12 + *(uint *)(uVar32 + 0x10 + lVar29)),
                                  *(undefined1 (*) [16])
                                   (pfVar11 + *(uint *)(uVar32 + 0x18 + lVar29)));
          auVar38 = vunpckhps_avx(*(undefined1 (*) [16])
                                   (pfVar12 + *(uint *)(uVar32 + 0x10 + lVar29)),
                                  *(undefined1 (*) [16])
                                   (pfVar11 + *(uint *)(uVar32 + 0x18 + lVar29)));
          auVar41 = vunpcklps_avx(*(undefined1 (*) [16])
                                   (pfVar14 + *(uint *)(uVar32 + 0x14 + lVar29)),
                                  *(undefined1 (*) [16])
                                   (pfVar13 + *(uint *)(uVar32 + 0x1c + lVar29)));
          auVar16 = vunpckhps_avx(*(undefined1 (*) [16])
                                   (pfVar14 + *(uint *)(uVar32 + 0x14 + lVar29)),
                                  *(undefined1 (*) [16])
                                   (pfVar13 + *(uint *)(uVar32 + 0x1c + lVar29)));
          auVar42 = vunpcklps_avx(auVar38,auVar16);
          auVar40 = vunpcklps_avx(auVar39,auVar41);
          auVar38 = vunpckhps_avx(auVar39,auVar41);
          auVar41 = vunpcklps_avx(*(undefined1 (*) [16])
                                   (pfVar12 + *(uint *)(uVar32 + 0x30 + lVar29)),
                                  *(undefined1 (*) [16])
                                   (pfVar11 + *(uint *)(uVar32 + 0x38 + lVar29)));
          auVar16 = vunpckhps_avx(*(undefined1 (*) [16])
                                   (pfVar12 + *(uint *)(uVar32 + 0x30 + lVar29)),
                                  *(undefined1 (*) [16])
                                   (pfVar11 + *(uint *)(uVar32 + 0x38 + lVar29)));
          auVar68 = vunpcklps_avx(*(undefined1 (*) [16])
                                   (pfVar14 + *(uint *)(uVar32 + 0x34 + lVar29)),
                                  *(undefined1 (*) [16])
                                   (pfVar13 + *(uint *)(uVar32 + 0x3c + lVar29)));
          auVar39 = vunpckhps_avx(*(undefined1 (*) [16])
                                   (pfVar14 + *(uint *)(uVar32 + 0x34 + lVar29)),
                                  *(undefined1 (*) [16])
                                   (pfVar13 + *(uint *)(uVar32 + 0x3c + lVar29)));
          auVar39 = vunpcklps_avx(auVar16,auVar39);
          auVar17 = vunpcklps_avx(auVar41,auVar68);
          auVar16 = vunpckhps_avx(auVar41,auVar68);
          uStack_13f0 = local_1400;
          uStack_13e8 = uStack_13f8;
          auVar43 = vunpcklps_avx(auVar55,auVar54);
          auVar44 = vunpcklps_avx(auVar50,auVar49);
          auVar48 = vunpcklps_avx(auVar44,auVar43);
          auVar44 = vunpckhps_avx(auVar44,auVar43);
          auVar43 = vunpckhps_avx(auVar55,auVar54);
          auVar45 = vunpckhps_avx(auVar50,auVar49);
          auVar45 = vunpcklps_avx(auVar45,auVar43);
          auVar52._16_16_ = auVar40;
          auVar52._0_16_ = auVar40;
          auVar56._16_16_ = auVar38;
          auVar56._0_16_ = auVar38;
          auVar51._16_16_ = auVar42;
          auVar51._0_16_ = auVar42;
          auVar57._16_16_ = auVar17;
          auVar57._0_16_ = auVar17;
          auVar58._16_16_ = auVar16;
          auVar58._0_16_ = auVar16;
          uVar7 = *(undefined4 *)&(ray->org).field_0;
          auVar59._4_4_ = uVar7;
          auVar59._0_4_ = uVar7;
          auVar59._8_4_ = uVar7;
          auVar59._12_4_ = uVar7;
          auVar59._16_4_ = uVar7;
          auVar59._20_4_ = uVar7;
          auVar59._24_4_ = uVar7;
          auVar59._28_4_ = uVar7;
          auVar46 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->org).field_0.m128[1]));
          auVar47 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->org).field_0.m128[2]));
          uVar7 = *(undefined4 *)&(ray->dir).field_0;
          auVar70._4_4_ = uVar7;
          auVar70._0_4_ = uVar7;
          auVar70._8_4_ = uVar7;
          auVar70._12_4_ = uVar7;
          auVar70._16_4_ = uVar7;
          auVar70._20_4_ = uVar7;
          auVar70._24_4_ = uVar7;
          auVar70._28_4_ = uVar7;
          auVar53._16_16_ = auVar39;
          auVar53._0_16_ = auVar39;
          uVar7 = *(undefined4 *)((long)&(ray->dir).field_0 + 4);
          auVar73._4_4_ = uVar7;
          auVar73._0_4_ = uVar7;
          auVar73._8_4_ = uVar7;
          auVar73._12_4_ = uVar7;
          auVar73._16_4_ = uVar7;
          auVar73._20_4_ = uVar7;
          auVar73._24_4_ = uVar7;
          auVar73._28_4_ = uVar7;
          fVar8 = (ray->dir).field_0.m128[2];
          auVar82._4_4_ = fVar8;
          auVar82._0_4_ = fVar8;
          auVar82._8_4_ = fVar8;
          auVar82._12_4_ = fVar8;
          auVar82._16_4_ = fVar8;
          auVar82._20_4_ = fVar8;
          auVar82._24_4_ = fVar8;
          auVar82._28_4_ = fVar8;
          auVar43 = vsubps_avx(auVar48,auVar59);
          auVar48 = vsubps_avx512vl(auVar44,auVar46);
          auVar45 = vsubps_avx512vl(auVar45,auVar47);
          auVar49 = vsubps_avx512vl(auVar52,auVar59);
          auVar50 = vsubps_avx512vl(auVar56,auVar46);
          auVar51 = vsubps_avx512vl(auVar51,auVar47);
          auVar52 = vsubps_avx512vl(auVar57,auVar59);
          auVar46 = vsubps_avx512vl(auVar58,auVar46);
          auVar47 = vsubps_avx512vl(auVar53,auVar47);
          auVar53 = vsubps_avx512vl(auVar52,auVar43);
          auVar44 = vsubps_avx(auVar46,auVar48);
          auVar54 = vsubps_avx512vl(auVar47,auVar45);
          auVar55 = vsubps_avx512vl(auVar43,auVar49);
          auVar56 = vsubps_avx512vl(auVar48,auVar50);
          auVar57 = vsubps_avx512vl(auVar45,auVar51);
          auVar58 = vsubps_avx512vl(auVar49,auVar52);
          auVar59 = vsubps_avx512vl(auVar50,auVar46);
          auVar60 = vsubps_avx512vl(auVar51,auVar47);
          auVar61 = vaddps_avx512vl(auVar52,auVar43);
          auVar83._0_4_ = auVar46._0_4_ + auVar48._0_4_;
          auVar83._4_4_ = auVar46._4_4_ + auVar48._4_4_;
          auVar83._8_4_ = auVar46._8_4_ + auVar48._8_4_;
          auVar83._12_4_ = auVar46._12_4_ + auVar48._12_4_;
          auVar83._16_4_ = auVar46._16_4_ + auVar48._16_4_;
          auVar83._20_4_ = auVar46._20_4_ + auVar48._20_4_;
          auVar83._24_4_ = auVar46._24_4_ + auVar48._24_4_;
          auVar83._28_4_ = auVar46._28_4_ + auVar48._28_4_;
          auVar62 = vaddps_avx512vl(auVar47,auVar45);
          auVar63 = vmulps_avx512vl(auVar83,auVar54);
          auVar63 = vfmsub231ps_avx512vl(auVar63,auVar44,auVar62);
          auVar62 = vmulps_avx512vl(auVar62,auVar53);
          auVar64 = vfmsub231ps_avx512vl(auVar62,auVar54,auVar61);
          auVar62._4_4_ = auVar44._4_4_ * auVar61._4_4_;
          auVar62._0_4_ = auVar44._0_4_ * auVar61._0_4_;
          auVar62._8_4_ = auVar44._8_4_ * auVar61._8_4_;
          auVar62._12_4_ = auVar44._12_4_ * auVar61._12_4_;
          auVar62._16_4_ = auVar44._16_4_ * auVar61._16_4_;
          auVar62._20_4_ = auVar44._20_4_ * auVar61._20_4_;
          auVar62._24_4_ = auVar44._24_4_ * auVar61._24_4_;
          auVar62._28_4_ = auVar61._28_4_;
          auVar38 = vfmsub231ps_fma(auVar62,auVar53,auVar83);
          auVar65._0_4_ = fVar8 * auVar38._0_4_;
          auVar65._4_4_ = fVar8 * auVar38._4_4_;
          auVar65._8_4_ = fVar8 * auVar38._8_4_;
          auVar65._12_4_ = fVar8 * auVar38._12_4_;
          auVar65._16_4_ = fVar8 * 0.0;
          auVar65._20_4_ = fVar8 * 0.0;
          auVar65._24_4_ = fVar8 * 0.0;
          auVar65._28_4_ = 0;
          auVar62 = vfmadd231ps_avx512vl(auVar65,auVar73,auVar64);
          local_13c0 = vfmadd231ps_avx512vl(auVar62,auVar70,auVar63);
          auVar62 = vaddps_avx512vl(auVar43,auVar49);
          auVar61 = vaddps_avx512vl(auVar48,auVar50);
          auVar63 = vaddps_avx512vl(auVar45,auVar51);
          auVar64 = vmulps_avx512vl(auVar61,auVar57);
          auVar64 = vfmsub231ps_avx512vl(auVar64,auVar56,auVar63);
          auVar63 = vmulps_avx512vl(auVar63,auVar55);
          auVar63 = vfmsub231ps_avx512vl(auVar63,auVar57,auVar62);
          auVar62 = vmulps_avx512vl(auVar62,auVar56);
          auVar62 = vfmsub231ps_avx512vl(auVar62,auVar55,auVar61);
          auVar65 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
          auVar61._4_4_ = fVar8 * auVar62._4_4_;
          auVar61._0_4_ = fVar8 * auVar62._0_4_;
          auVar61._8_4_ = fVar8 * auVar62._8_4_;
          auVar61._12_4_ = fVar8 * auVar62._12_4_;
          auVar61._16_4_ = fVar8 * auVar62._16_4_;
          auVar61._20_4_ = fVar8 * auVar62._20_4_;
          auVar61._24_4_ = fVar8 * auVar62._24_4_;
          auVar61._28_4_ = auVar62._28_4_;
          auVar62 = vfmadd231ps_avx512vl(auVar61,auVar73,auVar63);
          local_13a0 = vfmadd231ps_avx512vl(auVar62,auVar70,auVar64);
          auVar62 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          auVar61 = vaddps_avx512vl(auVar49,auVar52);
          auVar46 = vaddps_avx512vl(auVar50,auVar46);
          auVar47 = vaddps_avx512vl(auVar51,auVar47);
          auVar49 = vmulps_avx512vl(auVar46,auVar60);
          auVar49 = vfmsub231ps_avx512vl(auVar49,auVar59,auVar47);
          auVar47 = vmulps_avx512vl(auVar47,auVar58);
          auVar47 = vfmsub231ps_avx512vl(auVar47,auVar60,auVar61);
          auVar61 = vmulps_avx512vl(auVar61,auVar59);
          auVar46 = vfmsub231ps_avx512vl(auVar61,auVar58,auVar46);
          auVar46 = vmulps_avx512vl(auVar82,auVar46);
          auVar46 = vfmadd231ps_avx512vl(auVar46,auVar73,auVar47);
          auVar46 = vfmadd231ps_avx512vl(auVar46,auVar70,auVar49);
          auVar63._0_4_ = local_13a0._0_4_ + local_13c0._0_4_;
          auVar63._4_4_ = local_13a0._4_4_ + local_13c0._4_4_;
          auVar63._8_4_ = local_13a0._8_4_ + local_13c0._8_4_;
          auVar63._12_4_ = local_13a0._12_4_ + local_13c0._12_4_;
          auVar63._16_4_ = local_13a0._16_4_ + local_13c0._16_4_;
          auVar63._20_4_ = local_13a0._20_4_ + local_13c0._20_4_;
          auVar63._24_4_ = local_13a0._24_4_ + local_13c0._24_4_;
          auVar63._28_4_ = local_13a0._28_4_ + local_13c0._28_4_;
          local_1380 = vaddps_avx512vl(auVar46,auVar63);
          vandps_avx512vl(local_1380,auVar62);
          auVar47._8_4_ = 0x34000000;
          auVar47._0_8_ = 0x3400000034000000;
          auVar47._12_4_ = 0x34000000;
          auVar47._16_4_ = 0x34000000;
          auVar47._20_4_ = 0x34000000;
          auVar47._24_4_ = 0x34000000;
          auVar47._28_4_ = 0x34000000;
          auVar47 = vmulps_avx512vl(local_1380,auVar47);
          auVar61 = vminps_avx512vl(local_13c0,local_13a0);
          auVar61 = vminps_avx512vl(auVar61,auVar46);
          auVar49 = vxorps_avx512vl(auVar47,auVar65);
          uVar18 = vcmpps_avx512vl(auVar61,auVar49,5);
          auVar61 = vmaxps_avx512vl(local_13c0,local_13a0);
          auVar46 = vmaxps_avx512vl(auVar61,auVar46);
          uVar19 = vcmpps_avx512vl(auVar46,auVar47,2);
          local_1300 = (byte)uVar18 | (byte)uVar19;
          fVar76 = fStack_14dc;
          fVar77 = fStack_14d8;
          fVar78 = fStack_14d4;
          fVar79 = fStack_14d0;
          fVar80 = fStack_14cc;
          fVar81 = fStack_14c8;
          fVar66 = local_14e0;
          if (local_1300 == 0) {
LAB_01c6eef5:
            auVar69 = ZEXT3264(local_1500);
            auVar75 = ZEXT3264(local_1520);
            auVar67 = ZEXT3264(local_1540);
            auVar71 = ZEXT3264(local_1560);
          }
          else {
            auVar46 = vmulps_avx512vl(auVar54,auVar56);
            auVar47 = vmulps_avx512vl(auVar53,auVar57);
            auVar61 = vmulps_avx512vl(auVar44,auVar55);
            auVar49 = vmulps_avx512vl(auVar57,auVar59);
            auVar50 = vmulps_avx512vl(auVar55,auVar60);
            auVar51 = vmulps_avx512vl(auVar56,auVar58);
            auVar44 = vfmsub213ps_avx512vl(auVar44,auVar57,auVar46);
            auVar52 = vfmsub213ps_avx512vl(auVar54,auVar55,auVar47);
            auVar53 = vfmsub213ps_avx512vl(auVar53,auVar56,auVar61);
            auVar54 = vfmsub213ps_avx512vl(auVar60,auVar56,auVar49);
            auVar56 = vfmsub213ps_avx512vl(auVar58,auVar57,auVar50);
            auVar55 = vfmsub213ps_avx512vl(auVar59,auVar55,auVar51);
            vandps_avx512vl(auVar46,auVar62);
            vandps_avx512vl(auVar49,auVar62);
            uVar31 = vcmpps_avx512vl(auVar55,auVar55,1);
            vandps_avx512vl(auVar47,auVar62);
            vandps_avx512vl(auVar50,auVar62);
            auVar46 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
            uVar28 = vcmpps_avx512vl(auVar55,auVar55,1);
            vandps_avx512vl(auVar61,auVar62);
            vandps_avx512vl(auVar51,auVar62);
            uVar20 = vcmpps_avx512vl(auVar46,auVar46,1);
            bVar15 = (bool)((byte)uVar31 & 1);
            local_1360._0_4_ = (float)((uint)bVar15 * auVar44._0_4_ | (uint)!bVar15 * auVar54._0_4_)
            ;
            bVar15 = (bool)((byte)(uVar31 >> 1) & 1);
            local_1360._4_4_ = (float)((uint)bVar15 * auVar44._4_4_ | (uint)!bVar15 * auVar54._4_4_)
            ;
            bVar15 = (bool)((byte)(uVar31 >> 2) & 1);
            local_1360._8_4_ = (float)((uint)bVar15 * auVar44._8_4_ | (uint)!bVar15 * auVar54._8_4_)
            ;
            bVar15 = (bool)((byte)(uVar31 >> 3) & 1);
            local_1360._12_4_ =
                 (float)((uint)bVar15 * auVar44._12_4_ | (uint)!bVar15 * auVar54._12_4_);
            bVar15 = (bool)((byte)(uVar31 >> 4) & 1);
            local_1360._16_4_ =
                 (float)((uint)bVar15 * auVar44._16_4_ | (uint)!bVar15 * auVar54._16_4_);
            bVar15 = (bool)((byte)(uVar31 >> 5) & 1);
            local_1360._20_4_ =
                 (float)((uint)bVar15 * auVar44._20_4_ | (uint)!bVar15 * auVar54._20_4_);
            bVar15 = (bool)((byte)(uVar31 >> 6) & 1);
            local_1360._24_4_ =
                 (float)((uint)bVar15 * auVar44._24_4_ | (uint)!bVar15 * auVar54._24_4_);
            bVar15 = SUB81(uVar31 >> 7,0);
            local_1360._28_4_ = (uint)bVar15 * auVar44._28_4_ | (uint)!bVar15 * auVar54._28_4_;
            bVar15 = (bool)((byte)uVar28 & 1);
            local_1340._0_4_ = (float)((uint)bVar15 * auVar52._0_4_ | (uint)!bVar15 * auVar56._0_4_)
            ;
            bVar15 = (bool)((byte)(uVar28 >> 1) & 1);
            local_1340._4_4_ = (float)((uint)bVar15 * auVar52._4_4_ | (uint)!bVar15 * auVar56._4_4_)
            ;
            bVar15 = (bool)((byte)(uVar28 >> 2) & 1);
            local_1340._8_4_ = (float)((uint)bVar15 * auVar52._8_4_ | (uint)!bVar15 * auVar56._8_4_)
            ;
            bVar15 = (bool)((byte)(uVar28 >> 3) & 1);
            local_1340._12_4_ =
                 (float)((uint)bVar15 * auVar52._12_4_ | (uint)!bVar15 * auVar56._12_4_);
            bVar15 = (bool)((byte)(uVar28 >> 4) & 1);
            local_1340._16_4_ =
                 (float)((uint)bVar15 * auVar52._16_4_ | (uint)!bVar15 * auVar56._16_4_);
            bVar15 = (bool)((byte)(uVar28 >> 5) & 1);
            local_1340._20_4_ =
                 (float)((uint)bVar15 * auVar52._20_4_ | (uint)!bVar15 * auVar56._20_4_);
            bVar15 = (bool)((byte)(uVar28 >> 6) & 1);
            local_1340._24_4_ =
                 (float)((uint)bVar15 * auVar52._24_4_ | (uint)!bVar15 * auVar56._24_4_);
            bVar15 = SUB81(uVar28 >> 7,0);
            local_1340._28_4_ = (uint)bVar15 * auVar52._28_4_ | (uint)!bVar15 * auVar56._28_4_;
            bVar15 = (bool)((byte)uVar20 & 1);
            local_1320._0_4_ = (float)((uint)bVar15 * auVar53._0_4_ | (uint)!bVar15 * auVar55._0_4_)
            ;
            bVar15 = (bool)((byte)(uVar20 >> 1) & 1);
            local_1320._4_4_ = (float)((uint)bVar15 * auVar53._4_4_ | (uint)!bVar15 * auVar55._4_4_)
            ;
            bVar15 = (bool)((byte)(uVar20 >> 2) & 1);
            local_1320._8_4_ = (float)((uint)bVar15 * auVar53._8_4_ | (uint)!bVar15 * auVar55._8_4_)
            ;
            bVar15 = (bool)((byte)(uVar20 >> 3) & 1);
            local_1320._12_4_ =
                 (float)((uint)bVar15 * auVar53._12_4_ | (uint)!bVar15 * auVar55._12_4_);
            bVar15 = (bool)((byte)(uVar20 >> 4) & 1);
            local_1320._16_4_ =
                 (float)((uint)bVar15 * auVar53._16_4_ | (uint)!bVar15 * auVar55._16_4_);
            bVar15 = (bool)((byte)(uVar20 >> 5) & 1);
            local_1320._20_4_ =
                 (float)((uint)bVar15 * auVar53._20_4_ | (uint)!bVar15 * auVar55._20_4_);
            bVar15 = (bool)((byte)(uVar20 >> 6) & 1);
            local_1320._24_4_ =
                 (float)((uint)bVar15 * auVar53._24_4_ | (uint)!bVar15 * auVar55._24_4_);
            bVar15 = SUB81(uVar20 >> 7,0);
            local_1320._28_4_ = (uint)bVar15 * auVar53._28_4_ | (uint)!bVar15 * auVar55._28_4_;
            auVar25._4_4_ = fVar8 * local_1320._4_4_;
            auVar25._0_4_ = fVar8 * local_1320._0_4_;
            auVar25._8_4_ = fVar8 * local_1320._8_4_;
            auVar25._12_4_ = fVar8 * local_1320._12_4_;
            auVar25._16_4_ = fVar8 * local_1320._16_4_;
            auVar25._20_4_ = fVar8 * local_1320._20_4_;
            auVar25._24_4_ = fVar8 * local_1320._24_4_;
            auVar25._28_4_ = fVar8;
            auVar38 = vfmadd213ps_fma(auVar73,local_1340,auVar25);
            auVar38 = vfmadd213ps_fma(auVar70,local_1360,ZEXT1632(auVar38));
            auVar47 = ZEXT1632(CONCAT412(auVar38._12_4_ + auVar38._12_4_,
                                         CONCAT48(auVar38._8_4_ + auVar38._8_4_,
                                                  CONCAT44(auVar38._4_4_ + auVar38._4_4_,
                                                           auVar38._0_4_ + auVar38._0_4_))));
            auVar74._0_4_ = auVar45._0_4_ * local_1320._0_4_;
            auVar74._4_4_ = auVar45._4_4_ * local_1320._4_4_;
            auVar74._8_4_ = auVar45._8_4_ * local_1320._8_4_;
            auVar74._12_4_ = auVar45._12_4_ * local_1320._12_4_;
            auVar74._16_4_ = auVar45._16_4_ * local_1320._16_4_;
            auVar74._20_4_ = auVar45._20_4_ * local_1320._20_4_;
            auVar74._24_4_ = auVar45._24_4_ * local_1320._24_4_;
            auVar74._28_4_ = 0;
            auVar38 = vfmadd213ps_fma(auVar48,local_1340,auVar74);
            auVar16 = vfmadd213ps_fma(auVar43,local_1360,ZEXT1632(auVar38));
            auVar43 = vrcp14ps_avx512vl(auVar47);
            auVar60._8_4_ = 0x3f800000;
            auVar60._0_8_ = 0x3f8000003f800000;
            auVar60._12_4_ = 0x3f800000;
            auVar60._16_4_ = 0x3f800000;
            auVar60._20_4_ = 0x3f800000;
            auVar60._24_4_ = 0x3f800000;
            auVar60._28_4_ = 0x3f800000;
            auVar44 = vfnmadd213ps_avx512vl(auVar43,auVar47,auVar60);
            auVar38 = vfmadd132ps_fma(auVar44,auVar43,auVar43);
            local_12a0 = ZEXT1632(CONCAT412((auVar16._12_4_ + auVar16._12_4_) * auVar38._12_4_,
                                            CONCAT48((auVar16._8_4_ + auVar16._8_4_) * auVar38._8_4_
                                                     ,CONCAT44((auVar16._4_4_ + auVar16._4_4_) *
                                                               auVar38._4_4_,
                                                               (auVar16._0_4_ + auVar16._0_4_) *
                                                               auVar38._0_4_))));
            uVar7 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
            auVar64._4_4_ = uVar7;
            auVar64._0_4_ = uVar7;
            auVar64._8_4_ = uVar7;
            auVar64._12_4_ = uVar7;
            auVar64._16_4_ = uVar7;
            auVar64._20_4_ = uVar7;
            auVar64._24_4_ = uVar7;
            auVar64._28_4_ = uVar7;
            uVar18 = vcmpps_avx512vl(local_12a0,auVar64,0xd);
            auVar43 = vxorps_avx512vl(auVar47,auVar46);
            fVar8 = ray->tfar;
            auVar23._4_4_ = fVar8;
            auVar23._0_4_ = fVar8;
            auVar23._8_4_ = fVar8;
            auVar23._12_4_ = fVar8;
            auVar23._16_4_ = fVar8;
            auVar23._20_4_ = fVar8;
            auVar23._24_4_ = fVar8;
            auVar23._28_4_ = fVar8;
            uVar19 = vcmpps_avx512vl(local_12a0,auVar23,2);
            uVar21 = vcmpps_avx512vl(auVar47,auVar43,4);
            local_1300 = (byte)uVar18 & (byte)uVar19 & (byte)uVar21 & local_1300;
            if (local_1300 == 0) goto LAB_01c6eef5;
            local_1220 = 0xf0;
            auVar24._8_4_ = 0x219392ef;
            auVar24._0_8_ = 0x219392ef219392ef;
            auVar24._12_4_ = 0x219392ef;
            auVar24._16_4_ = 0x219392ef;
            auVar24._20_4_ = 0x219392ef;
            auVar24._24_4_ = 0x219392ef;
            auVar24._28_4_ = 0x219392ef;
            uVar31 = vcmpps_avx512vl(local_1380,auVar24,5);
            auVar44 = vrcp14ps_avx512vl(local_1380);
            auVar72._8_4_ = 0x3f800000;
            auVar72._0_8_ = 0x3f8000003f800000;
            auVar72._12_4_ = 0x3f800000;
            auVar72._16_4_ = 0x3f800000;
            auVar72._20_4_ = 0x3f800000;
            auVar72._24_4_ = 0x3f800000;
            auVar72._28_4_ = 0x3f800000;
            auVar38 = vfnmadd213ps_fma(local_1380,auVar44,auVar72);
            auVar43 = vfmadd132ps_avx512vl(ZEXT1632(auVar38),auVar44,auVar44);
            fVar1 = (float)((uint)((byte)uVar31 & 1) * auVar43._0_4_);
            fVar2 = (float)((uint)((byte)(uVar31 >> 1) & 1) * auVar43._4_4_);
            fVar3 = (float)((uint)((byte)(uVar31 >> 2) & 1) * auVar43._8_4_);
            fVar4 = (float)((uint)((byte)(uVar31 >> 3) & 1) * auVar43._12_4_);
            fVar5 = (float)((uint)((byte)(uVar31 >> 4) & 1) * auVar43._16_4_);
            fVar6 = (float)((uint)((byte)(uVar31 >> 5) & 1) * auVar43._20_4_);
            fVar8 = (float)((uint)((byte)(uVar31 >> 6) & 1) * auVar43._24_4_);
            auVar26._4_4_ = fVar2 * local_13c0._4_4_;
            auVar26._0_4_ = fVar1 * local_13c0._0_4_;
            auVar26._8_4_ = fVar3 * local_13c0._8_4_;
            auVar26._12_4_ = fVar4 * local_13c0._12_4_;
            auVar26._16_4_ = fVar5 * local_13c0._16_4_;
            auVar26._20_4_ = fVar6 * local_13c0._20_4_;
            auVar26._24_4_ = fVar8 * local_13c0._24_4_;
            auVar26._28_4_ = local_13c0._28_4_;
            auVar43 = vminps_avx(auVar26,auVar72);
            auVar27._4_4_ = local_13a0._4_4_ * fVar2;
            auVar27._0_4_ = local_13a0._0_4_ * fVar1;
            auVar27._8_4_ = local_13a0._8_4_ * fVar3;
            auVar27._12_4_ = local_13a0._12_4_ * fVar4;
            auVar27._16_4_ = local_13a0._16_4_ * fVar5;
            auVar27._20_4_ = local_13a0._20_4_ * fVar6;
            auVar27._24_4_ = local_13a0._24_4_ * fVar8;
            auVar27._28_4_ = auVar44._28_4_;
            auVar44 = vminps_avx(auVar27,auVar72);
            auVar45 = vsubps_avx(auVar72,auVar43);
            auVar48 = vsubps_avx(auVar72,auVar44);
            local_12c0 = vblendps_avx(auVar44,auVar45,0xf0);
            local_12e0 = vblendps_avx(auVar43,auVar48,0xf0);
            local_1280._4_4_ = local_1360._4_4_ * 1.0;
            local_1280._0_4_ = local_1360._0_4_ * 1.0;
            local_1280._8_4_ = local_1360._8_4_ * 1.0;
            local_1280._12_4_ = local_1360._12_4_ * 1.0;
            local_1280._16_4_ = local_1360._16_4_ * -1.0;
            local_1280._20_4_ = local_1360._20_4_ * -1.0;
            local_1280._24_4_ = local_1360._24_4_ * -1.0;
            local_1280._28_4_ = local_1360._28_4_;
            local_1260._4_4_ = local_1340._4_4_ * 1.0;
            local_1260._0_4_ = local_1340._0_4_ * 1.0;
            local_1260._8_4_ = local_1340._8_4_ * 1.0;
            local_1260._12_4_ = local_1340._12_4_ * 1.0;
            local_1260._16_4_ = local_1340._16_4_ * -1.0;
            local_1260._20_4_ = local_1340._20_4_ * -1.0;
            local_1260._24_4_ = local_1340._24_4_ * -1.0;
            local_1260._28_4_ = local_1340._28_4_;
            local_1240._4_4_ = local_1320._4_4_ * 1.0;
            local_1240._0_4_ = local_1320._0_4_ * 1.0;
            local_1240._8_4_ = local_1320._8_4_ * 1.0;
            local_1240._12_4_ = local_1320._12_4_ * 1.0;
            local_1240._16_4_ = local_1320._16_4_ * -1.0;
            local_1240._20_4_ = local_1320._20_4_ * -1.0;
            local_1240._24_4_ = local_1320._24_4_ * -1.0;
            local_1240._28_4_ = local_1320._28_4_;
            local_15f8 = (ulong)local_1300;
            auVar69 = ZEXT3264(local_1500);
            auVar75 = ZEXT3264(local_1520);
            auVar67 = ZEXT3264(local_1540);
            auVar71 = ZEXT3264(local_1560);
            do {
              local_1618 = 0;
              for (uVar31 = local_15f8; (uVar31 & 1) == 0; uVar31 = uVar31 >> 1 | 0x8000000000000000
                  ) {
                local_1618 = local_1618 + 1;
              }
              local_15a8 = *(uint *)((long)&local_13e0 + local_1618 * 4);
              local_1600 = (pSVar33->geometries).items[local_15a8].ptr;
              if ((local_1600->mask & ray->mask) == 0) {
                local_15f8 = local_15f8 ^ 1L << (local_1618 & 0x3f);
              }
              else {
                pRVar34 = local_15e0->args;
                if ((pRVar34->filter == (RTCFilterFunctionN)0x0) &&
                   (local_1600->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
LAB_01c6ef41:
                  ray->tfar = -INFINITY;
                  return;
                }
                local_14c0 = auVar89._0_32_;
                local_14a0 = auVar88._0_32_;
                local_1480 = auVar87._0_32_;
                local_1460 = auVar86._0_32_;
                local_1440 = auVar85._0_32_;
                local_1420 = auVar84._0_32_;
                uVar31 = (ulong)(uint)((int)local_1618 * 4);
                local_1590.context = local_15e0->user;
                local_15c0 = *(undefined4 *)(local_1280 + uVar31);
                local_15bc = *(undefined4 *)(local_1260 + uVar31);
                local_15b8 = *(undefined4 *)(local_1240 + uVar31);
                local_15b4 = *(undefined4 *)(local_12e0 + uVar31);
                local_15b0 = *(undefined4 *)(local_12c0 + uVar31);
                local_15ac = *(undefined4 *)((long)&local_1400 + uVar31);
                local_15a4 = (local_1590.context)->instID[0];
                local_15a0 = (local_1590.context)->instPrimID[0];
                fVar76 = ray->tfar;
                ray->tfar = *(float *)(local_12a0 + uVar31);
                local_161c = -1;
                local_1590.valid = &local_161c;
                local_1590.geometryUserPtr = local_1600->userPtr;
                local_1590.hit = (RTCHitN *)&local_15c0;
                local_1590.N = 1;
                local_1590.ray = (RTCRayN *)ray;
                if (((local_1600->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
                    (local_1608 = pRVar34, (*local_1600->occlusionFilterN)(&local_1590),
                    pRVar34 = local_1608, *local_1590.valid != 0)) &&
                   ((pRVar34->filter == (RTCFilterFunctionN)0x0 ||
                    ((((pRVar34->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                       RTC_RAY_QUERY_FLAG_INCOHERENT &&
                      (((local_1600->field_8).field_0x2 & 0x40) == 0)) ||
                     ((*pRVar34->filter)(&local_1590), *local_1590.valid != 0))))))
                goto LAB_01c6ef41;
                ray->tfar = fVar76;
                local_15f8 = local_15f8 ^ 1L << (local_1618 & 0x3f);
                auVar84 = ZEXT3264(local_1420);
                auVar85 = ZEXT3264(local_1440);
                auVar86 = ZEXT3264(local_1460);
                auVar87 = ZEXT3264(local_1480);
                auVar88 = ZEXT3264(local_14a0);
                auVar89 = ZEXT3264(local_14c0);
                auVar69 = ZEXT3264(local_1500);
                auVar75 = ZEXT3264(local_1520);
                auVar67 = ZEXT3264(local_1540);
                auVar71 = ZEXT3264(local_1560);
                pSVar33 = local_1610;
                fVar66 = local_14e0;
                fVar76 = fStack_14dc;
                fVar77 = fStack_14d8;
                fVar78 = fStack_14d4;
                fVar79 = fStack_14d0;
                fVar80 = fStack_14cc;
                fVar81 = fStack_14c8;
              }
            } while (local_15f8 != 0);
          }
        }
        goto LAB_01c6e5b4;
      }
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }